

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

UBool __thiscall
icu_63::NumeratorSubstitution::doParse
          (NumeratorSubstitution *this,UnicodeString *text,ParsePosition *parsePosition,
          double baseValue,double upperBound,UBool param_5,uint32_t nonNumericalExecutedRuleMask,
          Formattable *result)

{
  char16_t cVar1;
  int32_t iVar2;
  int32_t iVar3;
  NFRuleSet *this_00;
  bool bVar4;
  double local_198;
  long lStack_128;
  int32_t pow;
  int64_t d;
  int64_t n;
  Formattable temp;
  undefined1 local_98 [8];
  ParsePosition workPos;
  UnicodeString workText;
  int32_t zeroCount;
  UErrorCode status;
  Formattable *result_local;
  uint32_t nonNumericalExecutedRuleMask_local;
  UBool param_5_local;
  double upperBound_local;
  double baseValue_local;
  ParsePosition *parsePosition_local;
  UnicodeString *text_local;
  NumeratorSubstitution *this_local;
  
  workText.fUnion._52_4_ = 0;
  workText.fUnion._48_4_ = 0;
  UnicodeString::UnicodeString((UnicodeString *)&workPos.index,text);
  if (this->withZeros != '\0') {
    ParsePosition::ParsePosition((ParsePosition *)local_98,1);
    Formattable::Formattable((Formattable *)&n);
    while( true ) {
      iVar2 = UnicodeString::length((UnicodeString *)&workPos.index);
      bVar4 = false;
      if (0 < iVar2) {
        iVar2 = ParsePosition::getIndex((ParsePosition *)local_98);
        bVar4 = iVar2 != 0;
      }
      if (!bVar4) break;
      ParsePosition::setIndex((ParsePosition *)local_98,0);
      this_00 = NFSubstitution::getRuleSet(&this->super_NFSubstitution);
      NFRuleSet::parse(this_00,(UnicodeString *)&workPos.index,(ParsePosition *)local_98,1.0,
                       nonNumericalExecutedRuleMask,(Formattable *)&n);
      iVar2 = ParsePosition::getIndex((ParsePosition *)local_98);
      if (iVar2 == 0) break;
      workText.fUnion._48_4_ = workText.fUnion._48_4_ + 1;
      iVar2 = ParsePosition::getIndex(parsePosition);
      iVar3 = ParsePosition::getIndex((ParsePosition *)local_98);
      ParsePosition::setIndex(parsePosition,iVar2 + iVar3);
      ParsePosition::getIndex((ParsePosition *)local_98);
      UnicodeString::remove((UnicodeString *)&workPos.index,(char *)0x0);
      while( true ) {
        iVar2 = UnicodeString::length((UnicodeString *)&workPos.index);
        bVar4 = false;
        if (0 < iVar2) {
          cVar1 = UnicodeString::charAt((UnicodeString *)&workPos.index,0);
          bVar4 = cVar1 == L' ';
        }
        if (!bVar4) break;
        UnicodeString::remove((UnicodeString *)&workPos.index,(char *)0x0);
        iVar2 = ParsePosition::getIndex(parsePosition);
        ParsePosition::setIndex(parsePosition,iVar2 + 1);
      }
    }
    UnicodeString::operator=((UnicodeString *)&workPos.index,text);
    ParsePosition::getIndex(parsePosition);
    UnicodeString::remove((UnicodeString *)&workPos.index,(char *)0x0);
    ParsePosition::setIndex(parsePosition,0);
    Formattable::~Formattable((Formattable *)&n);
    ParsePosition::~ParsePosition((ParsePosition *)local_98);
  }
  local_198 = baseValue;
  if (this->withZeros != '\0') {
    local_198 = 1.0;
  }
  NFSubstitution::doParse
            (&this->super_NFSubstitution,(UnicodeString *)&workPos.index,parsePosition,local_198,
             upperBound,'\0',nonNumericalExecutedRuleMask,result);
  if (this->withZeros != '\0') {
    iVar2 = Formattable::getLong(result,(UErrorCode *)(workText.fUnion.fStackFields.fBuffer + 0x19))
    ;
    for (lStack_128 = 1; lStack_128 <= iVar2; lStack_128 = lStack_128 * 10) {
    }
    for (; 0 < (int)workText.fUnion._48_4_; workText.fUnion._48_4_ = workText.fUnion._48_4_ + -1) {
      lStack_128 = lStack_128 * 10;
    }
    Formattable::setDouble(result,(double)(long)iVar2 / (double)lStack_128);
  }
  UnicodeString::~UnicodeString((UnicodeString *)&workPos.index);
  return '\x01';
}

Assistant:

UBool 
NumeratorSubstitution::doParse(const UnicodeString& text, 
                               ParsePosition& parsePosition,
                               double baseValue,
                               double upperBound,
                               UBool /*lenientParse*/,
                               uint32_t nonNumericalExecutedRuleMask,
                               Formattable& result) const
{
    // we don't have to do anything special to do the parsing here,
    // but we have to turn lenient parsing off-- if we leave it on,
    // it SERIOUSLY messes up the algorithm

    // if withZeros is true, we need to count the zeros
    // and use that to adjust the parse result
    UErrorCode status = U_ZERO_ERROR;
    int32_t zeroCount = 0;
    UnicodeString workText(text);

    if (withZeros) {
        ParsePosition workPos(1);
        Formattable temp;

        while (workText.length() > 0 && workPos.getIndex() != 0) {
            workPos.setIndex(0);
            getRuleSet()->parse(workText, workPos, 1, nonNumericalExecutedRuleMask, temp); // parse zero or nothing at all
            if (workPos.getIndex() == 0) {
                // we failed, either there were no more zeros, or the number was formatted with digits
                // either way, we're done
                break;
            }

            ++zeroCount;
            parsePosition.setIndex(parsePosition.getIndex() + workPos.getIndex());
            workText.remove(0, workPos.getIndex());
            while (workText.length() > 0 && workText.charAt(0) == gSpace) {
                workText.remove(0, 1);
                parsePosition.setIndex(parsePosition.getIndex() + 1);
            }
        }

        workText = text;
        workText.remove(0, (int32_t)parsePosition.getIndex());
        parsePosition.setIndex(0);
    }

    // we've parsed off the zeros, now let's parse the rest from our current position
    NFSubstitution::doParse(workText, parsePosition, withZeros ? 1 : baseValue, upperBound, FALSE, nonNumericalExecutedRuleMask, result);

    if (withZeros) {
        // any base value will do in this case.  is there a way to
        // force this to not bother trying all the base values?

        // compute the 'effective' base and prescale the value down
        int64_t n = result.getLong(status); // force conversion!
        int64_t d = 1;
        int32_t pow = 0;
        while (d <= n) {
            d *= 10;
            ++pow;
        }
        // now add the zeros
        while (zeroCount > 0) {
            d *= 10;
            --zeroCount;
        }
        // d is now our true denominator
        result.setDouble((double)n/(double)d);
    }

    return TRUE;
}